

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O0

bool search(string *r,string *t,int flags)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  runtime_error *this;
  int in_EDX;
  string *in_RDI;
  ostringstream oss;
  bool v2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> m;
  bool v1;
  regex re;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_fffffffffffffdb0;
  string local_1f0 [32];
  ostringstream local_1d0 [383];
  byte local_51;
  undefined1 local_50 [47];
  byte local_21;
  regex local_20 [32];
  
  booster::regex::regex(local_20,in_RDI,in_EDX);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = std::__cxx11::string::c_str();
  iVar3 = std::__cxx11::string::size();
  local_21 = booster::regex::search((char *)local_20,pcVar4,iVar2 + iVar3);
  local_21 = local_21 & 1;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x1095f8);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  lVar5 = std::__cxx11::string::c_str();
  lVar6 = std::__cxx11::string::size();
  local_51 = booster::regex::search((char *)local_20,pcVar4,(vector *)(lVar5 + lVar6),(int)local_50)
  ;
  bVar1 = local_21;
  local_51 = local_51 & 1;
  if ((local_21 & 1) == local_51) {
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              (in_stack_fffffffffffffdb0);
    booster::regex::~regex(local_20);
    return (bool)(bVar1 & 1);
  }
  std::__cxx11::ostringstream::ostringstream(local_1d0);
  poVar7 = std::operator<<((ostream *)local_1d0,"Error ");
  poVar7 = std::operator<<(poVar7,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                          );
  poVar7 = std::operator<<(poVar7,":");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1d);
  std::operator<<(poVar7," v1==v2");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this,local_1f0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool search(std::string r,std::string t,int flags=0)
{
	booster::regex re(r,flags);
	bool v1 =  re.search(t.c_str(),t.c_str()+t.size());
	std::vector<std::pair<int,int> > m;
	bool v2 =  re.search(t.c_str(),t.c_str()+t.size(),m);
	TEST(v1==v2);
	return v1;
}